

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<long,_double>::InnerMap::TreeConvert(InnerMap *this,size_type b)

{
  bool bVar1;
  bool bVar2;
  pointer p;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  LogMessage *pLVar6;
  LogFinisher local_102;
  byte local_101;
  LogMessage local_100;
  size_type local_c8;
  size_type count;
  KeyCompare local_b1;
  set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  local_b0;
  pointer local_78;
  Tree *tree;
  other tree_allocator;
  LogMessage local_50;
  ulong local_18;
  size_type b_local;
  InnerMap *this_local;
  
  local_18 = b;
  b_local = (size_type)this;
  bVar2 = TableEntryIsTree(this,b);
  bVar1 = false;
  if ((bVar2) || (bVar2 = TableEntryIsTree(this,local_18 ^ 1), bVar2)) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x334);
    bVar1 = true;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: !TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)((long)&tree_allocator.arena_ + 3),pLVar6);
  }
  if (bVar1) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  Map<long,double>::
  MapAllocator<std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>>
  ::MapAllocator<google::protobuf::Map<long,double>::KeyValuePair>
            ((MapAllocator<std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>>
              *)&tree,&this->alloc_);
  p = MapAllocator<std::set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>_>
      ::allocate((MapAllocator<std::set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>_>
                  *)&tree,1,(void *)0x0);
  local_78 = p;
  Map<long,double>::MapAllocator<long*>::
  MapAllocator<google::protobuf::Map<long,double>::KeyValuePair>
            ((MapAllocator<long*> *)&count,&this->alloc_);
  std::
  set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  ::set(&local_b0,&local_b1,(allocator_type *)&count);
  Map<long,double>::
  MapAllocator<std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>>
  ::
  construct<std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>,std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>>
            ((MapAllocator<std::set<long*,google::protobuf::Map<long,double>::InnerMap::KeyCompare,google::protobuf::Map<long,double>::MapAllocator<long*>>>
              *)&tree,p,&local_b0);
  std::
  set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
  ::~set(&local_b0);
  sVar3 = CopyListToTree(this,local_18,local_78);
  sVar4 = CopyListToTree(this,local_18 ^ 1,local_78);
  local_c8 = sVar3 + sVar4;
  sVar5 = std::
          set<long_*,_google::protobuf::Map<long,_double>::InnerMap::KeyCompare,_google::protobuf::Map<long,_double>::MapAllocator<long_*>_>
          ::size(local_78);
  local_101 = 0;
  if (sVar3 + sVar4 != sVar5) {
    internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x33f);
    local_101 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (count) == (tree->size()): ");
    internal::LogFinisher::operator=(&local_102,pLVar6);
  }
  if ((local_101 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_100);
  }
  this->table_[local_18 ^ 1] = local_78;
  this->table_[local_18] = local_78;
  return;
}

Assistant:

void TreeConvert(size_type b) {
      GOOGLE_DCHECK(!TableEntryIsTree(b) && !TableEntryIsTree(b ^ 1));
      typename Allocator::template rebind<Tree>::other tree_allocator(alloc_);
      Tree* tree = tree_allocator.allocate(1);
      // We want to use the three-arg form of construct, if it exists, but we
      // create a temporary and use the two-arg construct that's known to exist.
      // It's clunky, but the compiler should be able to generate more-or-less
      // the same code.
      tree_allocator.construct(tree,
                               Tree(KeyCompare(), KeyPtrAllocator(alloc_)));
      // Now the tree is ready to use.
      size_type count = CopyListToTree(b, tree) + CopyListToTree(b ^ 1, tree);
      GOOGLE_DCHECK_EQ(count, tree->size());
      table_[b] = table_[b ^ 1] = static_cast<void*>(tree);
    }